

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

UResourceBundle *
init_resb_result(ResourceData *rdata,Resource r,char *key,int32_t idx,UResourceDataEntry *realData,
                UResourceBundle *parent,int32_t noAlias,UResourceBundle *resB,UErrorCode *status)

{
  int32_t *piVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  int32_t iVar4;
  UBool UVar5;
  UBool UVar6;
  UBool UVar7;
  UBool UVar8;
  undefined4 uVar9;
  int32_t iVar10;
  uint uVar11;
  int32_t iVar12;
  int iVar13;
  Resource RVar14;
  UChar *us;
  size_t sVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  UResourceBundle *resB_00;
  char *pcVar19;
  uint length;
  char *pcVar20;
  char *pcVar21;
  UResourceDataEntry *realData_00;
  UResourceBundle *parent_00;
  int32_t len;
  char *local_238;
  char *local_230;
  char *local_228;
  char *temp;
  UResourceBundle *local_218;
  ulong local_210;
  char *myPath;
  UErrorCode intStatus;
  char stackPath [256];
  char stackAlias [200];
  
  if (U_ZERO_ERROR < *status) {
    return resB;
  }
  if (parent == (UResourceBundle *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return (UResourceBundle *)0x0;
  }
  local_238 = key;
  if ((r & 0xf0000000) == 0x30000000) {
    local_210 = (ulong)(uint)noAlias;
    if (0xff < noAlias) {
      *status = U_TOO_MANY_ALIASES_ERROR;
      return resB;
    }
    local_230 = (char *)CONCAT44(local_230._4_4_,idx);
    len = 0;
    us = res_getAlias_63(rdata,r,&len);
    if (len < 1) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return resB;
    }
    length = len + 1;
    len = length;
    if (parent->fResPath == (char *)0x0) {
      uVar11 = 0;
    }
    else {
      sVar15 = strlen(parent->fResPath);
      uVar11 = (int)sVar15 + 1;
    }
    if ((int)uVar11 <= (int)length) {
      uVar11 = length;
    }
    local_218 = (UResourceBundle *)(ulong)uVar11;
    if (uVar11 < 0xc9) {
      pcVar19 = stackAlias;
      local_218 = (UResourceBundle *)0xc8;
    }
    else {
      pcVar19 = (char *)uprv_malloc_63((size_t)local_218);
      length = len;
      if (pcVar19 == (char *)0x0) goto LAB_001bd8b0;
    }
    u_UCharsToChars_63(us,pcVar19,length);
    if (*pcVar19 == '/') {
      pcVar21 = pcVar19 + 1;
      pcVar17 = strchr(pcVar21,0x2f);
      if (pcVar17 == (char *)0x0) {
        sVar15 = strlen(pcVar19);
        pcVar17 = pcVar19 + sVar15;
      }
      else {
        *pcVar17 = '\0';
        pcVar17 = pcVar17 + 1;
      }
      iVar13 = strcmp(pcVar21,"LOCALE");
      if (iVar13 == 0) {
        pcVar21 = realData->fPath;
        pcVar20 = parent->fTopLevelData->fName;
        local_228 = pcVar17;
      }
      else {
        iVar13 = strcmp(pcVar21,"ICUDATA");
        if (iVar13 == 0) {
          pcVar21 = (char *)0x0;
        }
        pcVar18 = strchr(pcVar17,0x2f);
        pcVar20 = pcVar17;
        if (pcVar18 == (char *)0x0) {
          local_228 = (char *)0x0;
        }
        else {
          *pcVar18 = '\0';
          local_228 = pcVar18 + 1;
        }
      }
    }
    else {
      local_228 = strchr(pcVar19,0x2f);
      if (local_228 == (char *)0x0) {
        local_228 = (char *)0x0;
      }
      else {
        *local_228 = '\0';
        local_228 = local_228 + 1;
      }
      pcVar21 = realData->fPath;
      pcVar20 = pcVar19;
    }
    temp = (char *)0x0;
    intStatus = U_ZERO_ERROR;
    resB_00 = ures_openDirect_63(pcVar21,pcVar20,&intStatus);
    if (intStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      if (local_228 == (char *)0x0) {
        stackPath._0_8_ = parent->fResPath;
        if ((char *)stackPath._0_8_ == (char *)0x0) {
          RVar14 = resB_00->fRes;
          stackPath[0] = '\0';
          stackPath[1] = '\0';
          stackPath[2] = '\0';
          stackPath[3] = '\0';
          stackPath[4] = '\0';
          stackPath[5] = '\0';
          stackPath[6] = '\0';
          stackPath[7] = '\0';
        }
        else {
          strcpy(pcVar19,(char *)stackPath._0_8_);
          stackPath._0_8_ = pcVar19;
          RVar14 = res_findResource_63(&resB_00->fResData,resB_00->fRes,(char **)stackPath,&temp);
        }
        if (local_238 == (char *)0x0) {
          if ((int)local_230 != -1) {
            if ((RVar14 & 0xf0000000) == 0x20000000 || (RVar14 & 0xe0000000) == 0x40000000) {
              RVar14 = res_getTableItemByIndex_63
                                 (&resB_00->fResData,RVar14,(int)local_230,(char **)stackPath);
            }
            else {
              RVar14 = res_getArrayItem_63(&resB_00->fResData,RVar14,(int)local_230);
            }
          }
        }
        else {
          sVar15 = strlen(local_238);
          len = (int)sVar15 + 1;
          if ((int)local_218 < len) {
            if (pcVar19 == stackAlias) {
              pcVar19 = (char *)uprv_malloc_63((ulong)(uint)len);
            }
            else {
              pcVar19 = (char *)uprv_realloc_63(pcVar19,(ulong)(uint)len);
            }
            if (pcVar19 == (char *)0x0) {
              ures_close_63(resB_00);
              *status = U_MEMORY_ALLOCATION_ERROR;
              return (UResourceBundle *)0x0;
            }
          }
          memcpy(pcVar19,local_238,(long)len);
          stackPath._0_8_ = pcVar19;
          RVar14 = res_findResource_63(&resB_00->fResData,RVar14,(char **)stackPath,&temp);
        }
        if (RVar14 == 0xffffffff) {
          *status = U_MISSING_RESOURCE_ERROR;
        }
        else {
          resB = init_resb_result(&resB_00->fResData,RVar14,temp,-1,resB_00->fData,resB_00,
                                  noAlias + 1,resB,status);
        }
      }
      else {
        realData_00 = resB_00->fData;
        pcVar21 = stackPath;
        local_230 = pcVar19;
        myPath = pcVar21;
        sVar15 = strlen(local_228);
        pcVar19 = pcVar21;
        if ((0x100 < sVar15) &&
           (pcVar19 = (char *)uprv_malloc_63(sVar15 + 1), pcVar19 == (char *)0x0)) {
          *status = U_MEMORY_ALLOCATION_ERROR;
          ures_close_63(resB_00);
          return (UResourceBundle *)0x0;
        }
        strcpy(pcVar19,local_228);
        local_210 = (ulong)((int)local_210 + 1);
        parent_00 = resB_00;
        local_238 = pcVar19;
        local_218 = resB_00;
        do {
          RVar14 = (realData_00->fData).rootRes;
          while( true ) {
            if ((*pcVar21 == '\0') || (U_ZERO_ERROR < *status)) goto LAB_001bdac4;
            RVar14 = res_findResource_63(&realData_00->fData,RVar14,&myPath,&temp);
            if (RVar14 == 0xffffffff) break;
            resB = init_resb_result(&realData_00->fData,RVar14,temp,-1,realData_00,parent_00,
                                    (int32_t)local_210,resB,status);
            pcVar21 = myPath;
            parent_00 = resB;
            if (resB != (UResourceBundle *)0x0) {
              RVar14 = resB->fRes;
              realData_00 = resB->fData;
            }
          }
          RVar14 = 0xffffffff;
LAB_001bdac4:
          pcVar21 = local_238;
          realData_00 = realData_00->fParent;
          strcpy(local_238,local_228);
          resB_00 = local_218;
          pcVar19 = local_230;
          myPath = pcVar21;
        } while ((RVar14 == 0xffffffff) && (realData_00 != (UResourceDataEntry *)0x0));
        if (RVar14 == 0xffffffff) {
          *status = U_MISSING_RESOURCE_ERROR;
          parent_00 = resB;
        }
        resB = parent_00;
        if (local_238 != stackPath) {
          uprv_free_63(local_238);
        }
      }
    }
    else {
      *status = intStatus;
    }
    if (pcVar19 != stackAlias) {
      uprv_free_63(pcVar19);
    }
    if (resB_00 != resB) {
      ures_close_63(resB_00);
      return resB;
    }
    return resB;
  }
  local_230 = (char *)CONCAT44(local_230._4_4_,idx);
  if (resB == (UResourceBundle *)0x0) {
    resB = (UResourceBundle *)uprv_malloc_63(200);
    if (resB == (UResourceBundle *)0x0) {
LAB_001bd8b0:
      *status = U_MEMORY_ALLOCATION_ERROR;
      return (UResourceBundle *)0x0;
    }
    resB->fMagic1 = 0x12c9b17;
    resB->fMagic2 = 0x12bb38b;
    resB->fResPath = (char *)0x0;
    resB->fResPathLen = 0;
  }
  else {
    if (resB->fData != (UResourceDataEntry *)0x0) {
      entryClose(resB->fData);
    }
    if (resB->fVersion != (char *)0x0) {
      uprv_free_63(resB->fVersion);
    }
    if (parent != resB) {
      ures_freeResPath(resB);
    }
  }
  resB->fData = realData;
  entryIncrease(realData);
  resB->fHasFallback = '\0';
  resB->fIsTopLevel = '\0';
  resB->fIndex = -1;
  resB->fKey = local_238;
  resB->fTopLevelData = parent->fTopLevelData;
  if (resB != parent && parent->fResPath != (char *)0x0) {
    ures_appendResPath(resB,parent->fResPath,parent->fResPathLen,status);
  }
  pcVar19 = local_238;
  if (local_238 == (char *)0x0) {
    if ((int)local_230 < 0) goto LAB_001bd7c0;
    pcVar19 = stackPath;
    iVar12 = T_CString_integerToString_63(pcVar19,(int)local_230,10);
  }
  else {
    sVar15 = strlen(local_238);
    iVar12 = (int32_t)sVar15;
  }
  ures_appendResPath(resB,pcVar19,iVar12,status);
  if (resB->fResPath[(long)resB->fResPathLen + -1] != '/') {
    ures_appendResPath(resB,"/",1,status);
  }
LAB_001bd7c0:
  if (resB->fResBuf == resB->fResPath) {
    lVar16 = (long)resB->fResPathLen;
  }
  else {
    lVar16 = 0;
  }
  memset(resB->fResBuf + lVar16,0,0x40 - lVar16);
  resB->fVersion = (char *)0x0;
  resB->fRes = r;
  piVar1 = rdata->pRoot;
  puVar2 = rdata->p16BitUnits;
  pcVar19 = rdata->poolBundleKeys;
  RVar14 = rdata->rootRes;
  iVar10 = rdata->localKeyLimit;
  puVar3 = rdata->poolBundleStrings;
  iVar12 = rdata->poolStringIndexLimit;
  iVar4 = rdata->poolStringIndex16Limit;
  UVar5 = rdata->noFallback;
  UVar6 = rdata->isPoolBundle;
  UVar7 = rdata->usesPoolBundle;
  UVar8 = rdata->useNativeStrcmp;
  uVar9 = *(undefined4 *)&rdata->field_0x3c;
  (resB->fResData).data = rdata->data;
  (resB->fResData).pRoot = piVar1;
  (resB->fResData).poolStringIndexLimit = iVar12;
  (resB->fResData).poolStringIndex16Limit = iVar4;
  (resB->fResData).noFallback = UVar5;
  (resB->fResData).isPoolBundle = UVar6;
  (resB->fResData).usesPoolBundle = UVar7;
  (resB->fResData).useNativeStrcmp = UVar8;
  *(undefined4 *)&(resB->fResData).field_0x3c = uVar9;
  (resB->fResData).rootRes = RVar14;
  (resB->fResData).localKeyLimit = iVar10;
  (resB->fResData).poolBundleStrings = puVar3;
  (resB->fResData).p16BitUnits = puVar2;
  (resB->fResData).poolBundleKeys = pcVar19;
  iVar12 = res_countArrayItems_63(&resB->fResData,r);
  resB->fSize = iVar12;
  return resB;
}

Assistant:

static UResourceBundle *init_resb_result(const ResourceData *rdata, Resource r, 
                                         const char *key, int32_t idx, UResourceDataEntry *realData, 
                                         const UResourceBundle *parent, int32_t noAlias,
                                         UResourceBundle *resB, UErrorCode *status) 
{
    if(status == NULL || U_FAILURE(*status)) {
        return resB;
    }
    if (parent == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    if(RES_GET_TYPE(r) == URES_ALIAS) { /* This is an alias, need to exchange with real data */
        if(noAlias < URES_MAX_ALIAS_LEVEL) { 
            int32_t len = 0;
            const UChar *alias = res_getAlias(rdata, r, &len); 
            if(len > 0) {
                /* we have an alias, now let's cut it up */
                char stackAlias[200];
                char *chAlias = NULL, *path = NULL, *locale = NULL, *keyPath = NULL;
                int32_t capacity;

                /*
                * Allocate enough space for both the char * version
                * of the alias and parent->fResPath.
                *
                * We do this so that res_findResource() can modify the path,
                * which allows us to remove redundant _res_findResource() variants
                * in uresdata.c.
                * res_findResource() now NUL-terminates each segment so that table keys
                * can always be compared with strcmp() instead of strncmp().
                * Saves code there and simplifies testing and code coverage.
                *
                * markus 2003oct17
                */
                ++len; /* count the terminating NUL */
                if(parent->fResPath != NULL) {
                    capacity = (int32_t)uprv_strlen(parent->fResPath) + 1;
                } else {
                    capacity = 0;
                }
                if(capacity < len) {
                    capacity = len;
                }
                if(capacity <= (int32_t)sizeof(stackAlias)) {
                    capacity = (int32_t)sizeof(stackAlias);
                    chAlias = stackAlias;
                } else {
                    chAlias = (char *)uprv_malloc(capacity);
                    /* test for NULL */
                    if(chAlias == NULL) {
                        *status = U_MEMORY_ALLOCATION_ERROR;
                        return NULL;
                    }
                }
                u_UCharsToChars(alias, chAlias, len);

                if(*chAlias == RES_PATH_SEPARATOR) {
                    /* there is a path included */
                    locale = uprv_strchr(chAlias+1, RES_PATH_SEPARATOR);
                    if(locale == NULL) {
                        locale = uprv_strchr(chAlias, 0); /* avoid locale == NULL to make code below work */
                    } else {
                        *locale = 0;
                        locale++;
                    }
                    path = chAlias+1;
                    if(uprv_strcmp(path, "LOCALE") == 0) {
                        /* this is an XPath alias, starting with "/LOCALE/" */
                        /* it contains the path to a resource which should be looked up */
                        /* starting in the requested locale */
                        keyPath = locale; 
                        locale = parent->fTopLevelData->fName; /* this is the requested locale's name */
                        path = realData->fPath; /* we will be looking in the same package */
                    } else {
                        if(uprv_strcmp(path, "ICUDATA") == 0) { /* want ICU data */
                            path = NULL;
                        }
                        keyPath = uprv_strchr(locale, RES_PATH_SEPARATOR);
                        if(keyPath) {
                            *keyPath = 0;
                            keyPath++;
                        }
                    }
                } else {
                    /* no path, start with a locale */
                    locale = chAlias;
                    keyPath = uprv_strchr(locale, RES_PATH_SEPARATOR);
                    if(keyPath) {
                        *keyPath = 0;
                        keyPath++;
                    }
                    path = realData->fPath;
                }


                {
                    /* got almost everything, let's try to open */
                    /* first, open the bundle with real data */
                    UResourceBundle *result = resB;
                    const char* temp = NULL;
                    UErrorCode intStatus = U_ZERO_ERROR;
                    UResourceBundle *mainRes = ures_openDirect(path, locale, &intStatus); 
                    if(U_SUCCESS(intStatus)) {
                        if(keyPath == NULL) {
                            /* no key path. This means that we are going to 
                            * to use the corresponding resource from
                            * another bundle
                            */
                            /* first, we are going to get a corresponding parent 
                            * resource to the one we are searching.
                            */
                            char *aKey = parent->fResPath;
                            if(aKey) {
                                uprv_strcpy(chAlias, aKey); /* allocated large enough above */
                                aKey = chAlias;
                                r = res_findResource(&(mainRes->fResData), mainRes->fRes, &aKey, &temp);
                            } else {
                                r = mainRes->fRes;
                            }
                            if(key) {
                                /* we need to make keyPath from parent's fResPath and
                                * current key, if there is a key associated
                                */
                                len = (int32_t)(uprv_strlen(key) + 1);
                                if(len > capacity) {
                                    capacity = len;
                                    if(chAlias == stackAlias) {
                                        chAlias = (char *)uprv_malloc(capacity);
                                    } else {
                                        chAlias = (char *)uprv_realloc(chAlias, capacity);
                                    }
                                    if(chAlias == NULL) {
                                        ures_close(mainRes);
                                        *status = U_MEMORY_ALLOCATION_ERROR;
                                        return NULL;
                                    }
                                }
                                uprv_memcpy(chAlias, key, len);
                                aKey = chAlias;
                                r = res_findResource(&(mainRes->fResData), r, &aKey, &temp);
                            } else if(idx != -1) {
                                /* if there is no key, but there is an index, try to get by the index */
                                /* here we have either a table or an array, so get the element */
                                int32_t type = RES_GET_TYPE(r);
                                if(URES_IS_TABLE(type)) {
                                    r = res_getTableItemByIndex(&(mainRes->fResData), r, idx, (const char **)&aKey);
                                } else { /* array */
                                    r = res_getArrayItem(&(mainRes->fResData), r, idx);
                                }
                            }
                            if(r != RES_BOGUS) {
                                result = init_resb_result(&(mainRes->fResData), r, temp, -1, mainRes->fData, mainRes, noAlias+1, resB, status);
                            } else {
                                *status = U_MISSING_RESOURCE_ERROR;
                                result = resB;
                            }
                        } else {
                            /* this one is a bit trickier. 
                            * we start finding keys, but after we resolve one alias, the path might continue.
                            * Consider: 
                            *     aliastest:alias { "testtypes/anotheralias/Sequence" }
                            *     anotheralias:alias { "/ICUDATA/sh/CollationElements" }
                            * aliastest resource should finally have the sequence, not collation elements.
                            */
                            UResourceDataEntry *dataEntry = mainRes->fData;
                            char stackPath[URES_MAX_BUFFER_SIZE];
                            char *pathBuf = stackPath, *myPath = pathBuf;
                            if(uprv_strlen(keyPath) > URES_MAX_BUFFER_SIZE) {
                                pathBuf = (char *)uprv_malloc((uprv_strlen(keyPath)+1)*sizeof(char));
                                if(pathBuf == NULL) {
                                    *status = U_MEMORY_ALLOCATION_ERROR;
                                    ures_close(mainRes);
                                    return NULL;
                                }
                            }
                            uprv_strcpy(pathBuf, keyPath);
                            result = mainRes;
                            /* now we have fallback following here */
                            do {
                                r = dataEntry->fData.rootRes;     
                                /* this loop handles 'found' resources over several levels */
                                while(*myPath && U_SUCCESS(*status)) {
                                    r = res_findResource(&(dataEntry->fData), r, &myPath, &temp);
                                    if(r != RES_BOGUS) { /* found a resource, but it might be an indirection */
                                        resB = init_resb_result(&(dataEntry->fData), r, temp, -1, dataEntry, result, noAlias+1, resB, status);
                                        result = resB;
                                        if(result) {
                                            r = result->fRes; /* switch to a new resource, possibly a new tree */
                                            dataEntry = result->fData;
                                        }
                                    } else { /* no resource found, we don't really want to look anymore on this level */
                                        break;
                                    }
                                }
                                dataEntry = dataEntry->fParent;
                                uprv_strcpy(pathBuf, keyPath);
                                myPath = pathBuf;
                            } while(r == RES_BOGUS && dataEntry != NULL);
                            if(r == RES_BOGUS) {
                                *status = U_MISSING_RESOURCE_ERROR;
                                result = resB;
                            }
                            if(pathBuf != stackPath) {
                                uprv_free(pathBuf);
                            }
                        }
                    } else { /* we failed to open the resource we're aliasing to */
                        *status = intStatus;
                    }
                    if(chAlias != stackAlias) {
                        uprv_free(chAlias);
                    }
                    if(mainRes != result) {
                        ures_close(mainRes);
                    }
                    return result;
                }
            } else {
                /* bad alias, should be an error */ 
                *status = U_ILLEGAL_ARGUMENT_ERROR;
                return resB;
            }
        } else {
            *status = U_TOO_MANY_ALIASES_ERROR;
            return resB;
        }
    }
    if(resB == NULL) {
        resB = (UResourceBundle *)uprv_malloc(sizeof(UResourceBundle));
        /* test for NULL */
        if (resB == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        ures_setIsStackObject(resB, FALSE);
        resB->fResPath = NULL;
        resB->fResPathLen = 0;
    } else {
        if(resB->fData != NULL) {
            entryClose(resB->fData);
        }
        if(resB->fVersion != NULL) {
            uprv_free(resB->fVersion);
        }
        /* 
        weiv: if stack object was passed in, it doesn't really need to be reinited,
        since the purpose of initing is to remove stack junk. However, at this point 
        we would not do anything to an allocated object, so stack object should be
        treated the same
        */
        /*
        if(ures_isStackObject(resB) != FALSE) {
        ures_initStackObject(resB);
        }
        */
        if(parent != resB) {
            ures_freeResPath(resB);
        }
    }
    resB->fData = realData;
    entryIncrease(resB->fData);
    resB->fHasFallback = FALSE;
    resB->fIsTopLevel = FALSE;
    resB->fIndex = -1;
    resB->fKey = key; 
    /*resB->fParentRes = parent;*/
    resB->fTopLevelData = parent->fTopLevelData;
    if(parent->fResPath && parent != resB) {
        ures_appendResPath(resB, parent->fResPath, parent->fResPathLen, status);
    }
    if(key != NULL) {
        ures_appendResPath(resB, key, (int32_t)uprv_strlen(key), status);
        if(resB->fResPath[resB->fResPathLen-1] != RES_PATH_SEPARATOR) {
            ures_appendResPath(resB, RES_PATH_SEPARATOR_S, 1, status);
        }
    } else if(idx >= 0) {
        char buf[256];
        int32_t len = T_CString_integerToString(buf, idx, 10);
        ures_appendResPath(resB, buf, len, status);
        if(resB->fResPath[resB->fResPathLen-1] != RES_PATH_SEPARATOR) {
            ures_appendResPath(resB, RES_PATH_SEPARATOR_S, 1, status);
        }
    }
    /* Make sure that Purify doesn't complain about uninitialized memory copies. */
    {
        int32_t usedLen = ((resB->fResBuf == resB->fResPath) ? resB->fResPathLen : 0);
        uprv_memset(resB->fResBuf + usedLen, 0, sizeof(resB->fResBuf) - usedLen);
    }

    resB->fVersion = NULL;
    resB->fRes = r;
    /*resB->fParent = parent->fRes;*/
    uprv_memmove(&resB->fResData, rdata, sizeof(ResourceData));
    resB->fSize = res_countArrayItems(&(resB->fResData), resB->fRes);
    return resB;
}